

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctsa.c
# Opt level: O0

void sarimax_setMethod(sarimax_object obj,int value)

{
  int value_local;
  sarimax_object obj_local;
  
  if (value == 0) {
    obj->method = 0;
  }
  else if (value == 1) {
    obj->method = 1;
  }
  else if (value == 2) {
    obj->method = 2;
  }
  else {
    printf("\n Acceptable Numerical Values 0 - CSS-MLE, 1 - MLE, 2 - CSS \n");
  }
  return;
}

Assistant:

void sarimax_setMethod(sarimax_object obj, int value) {
	if (value == 0) {
		obj->method = 0;
	}
	else if (value == 1) {
		obj->method = 1;
	}
	else if (value == 2) {
		obj->method = 2;
	}
	else {
		printf("\n Acceptable Numerical Values 0 - CSS-MLE, 1 - MLE, 2 - CSS \n");
	}
}